

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_JR(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char local_828 [8];
  char el [2048];
  uint local_20;
  Z80Cond local_1c;
  aint jrad;
  Z80Cond cc;
  int e [4];
  
  do {
    _jrad = 0xffffffffffffffff;
    e[0] = -1;
    e[1] = -1;
    local_1c = getz80cond(&::lp);
    if (local_1c == Z80C_UNK) {
      _jrad = CONCAT44(cc,0x18);
    }
    else {
      if (0x18 < (int)local_1c) {
        Error("[JR] Illegal condition",bp,PASS3);
        SkipToEol(&::lp);
        Relocation::isResultAffected = 0;
        return;
      }
      bVar1 = comma(&::lp);
      if (bVar1) {
        _jrad = CONCAT44(cc,local_1c + Z80C_PO);
      }
      else {
        Error("[JR cc] Comma expected",bp,PASS3);
      }
    }
    local_20 = 0;
    iVar2 = GetAddress(&::lp,(aint *)&local_20);
    if (iVar2 != 0) {
      local_20 = local_20 - (CurAddress + 2);
    }
    if (((int)local_20 < -0x80) || (0x7f < (int)local_20)) {
      snprintf(local_828,0x800,"[JR] Target out of range (%+i)",(ulong)local_20);
      Error(local_828,(char *)0x0,PASS3);
      local_20 = 0;
    }
    _jrad = CONCAT44(local_20,jrad) & 0xffffffffff;
    EmitBytes(&jrad,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
  } while ((uVar3 & 1) != 0);
  Relocation::isResultAffected = 0;
  return;
}

Assistant:

static void OpCode_JR() {
		do {
			int e[] { -1, -1, -1, -1 };
			Z80Cond cc = getz80cond(lp);
			if (Z80C_UNK == cc) e[0] = 0x18;
			else if (cc <= Z80C_C) {
				if (comma(lp)) e[0] = 0x20 + cc;
				else Error("[JR cc] Comma expected", bp);
			} else {
				Error("[JR] Illegal condition", bp);
				SkipToEol(lp);
				break;
			}
			aint jrad=0;
			if (GetAddress(lp, jrad)) jrad -= CurAddress + 2;
			if (jrad < -128 || jrad > 127) {
				char el[LINEMAX];
				SPRINTF1(el, LINEMAX, "[JR] Target out of range (%+i)", jrad);
				Error(el);
				jrad = 0;
			}
			e[1] = jrad & 0xFF;
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
		Relocation::isResultAffected = false;	// relative jump is always relocatable
	}